

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWeakMapPrototype
               (DynamicObject *weakMapPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *weakMapPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakMapPrototype,mode,6,0);
  this = RecyclableObject::GetScriptContext(&weakMapPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&weakMapPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).weakMapConstructor
                      );
  AddMember(this_00,weakMapPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,weakMapPrototype,0x6f,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Delete,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,weakMapPrototype,0x198,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Get,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,weakMapPrototype,0xb4,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Has,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,weakMapPrototype,0x19b,(FunctionInfo *)JavascriptWeakMap::EntryInfo::Set,2,
             '\x06');
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<8ul>(this_00,(char16 (*) [8])L"WeakMap");
    AddMember(this_00,weakMapPrototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(weakMapPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakMapPrototype(DynamicObject* weakMapPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakMapPrototype, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakMap
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = weakMapPrototype->GetScriptContext();
        JavascriptLibrary* library = weakMapPrototype->GetLibrary();
        library->AddMember(weakMapPrototype, PropertyIds::constructor, library->weakMapConstructor);

        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::delete_, &JavascriptWeakMap::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::get, &JavascriptWeakMap::EntryInfo::Get, 1);
        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::has, &JavascriptWeakMap::EntryInfo::Has, 1);
        library->AddFunctionToLibraryObject(weakMapPrototype, PropertyIds::set, &JavascriptWeakMap::EntryInfo::Set, 2);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(weakMapPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WeakMap")), PropertyConfigurable);
        }

        weakMapPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }